

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

char * httplib::detail::status_message(int status)

{
  char *pcStack_10;
  int status_local;
  
  switch(status) {
  case 100:
    pcStack_10 = "Continue";
    break;
  case 0x65:
    pcStack_10 = "Switching Protocol";
    break;
  case 0x66:
    pcStack_10 = "Processing";
    break;
  case 0x67:
    pcStack_10 = "Early Hints";
    break;
  default:
  case 500:
    pcStack_10 = "Internal Server Error";
    break;
  case 200:
    pcStack_10 = "OK";
    break;
  case 0xc9:
    pcStack_10 = "Created";
    break;
  case 0xca:
    pcStack_10 = "Accepted";
    break;
  case 0xcb:
    pcStack_10 = "Non-Authoritative Information";
    break;
  case 0xcc:
    pcStack_10 = "No Content";
    break;
  case 0xcd:
    pcStack_10 = "Reset Content";
    break;
  case 0xce:
    pcStack_10 = "Partial Content";
    break;
  case 0xcf:
    pcStack_10 = "Multi-Status";
    break;
  case 0xd0:
    pcStack_10 = "Already Reported";
    break;
  case 0xe2:
    pcStack_10 = "IM Used";
    break;
  case 300:
    pcStack_10 = "Multiple Choice";
    break;
  case 0x12d:
    pcStack_10 = "Moved Permanently";
    break;
  case 0x12e:
    pcStack_10 = "Found";
    break;
  case 0x12f:
    pcStack_10 = "See Other";
    break;
  case 0x130:
    pcStack_10 = "Not Modified";
    break;
  case 0x131:
    pcStack_10 = "Use Proxy";
    break;
  case 0x132:
    pcStack_10 = "unused";
    break;
  case 0x133:
    pcStack_10 = "Temporary Redirect";
    break;
  case 0x134:
    pcStack_10 = "Permanent Redirect";
    break;
  case 400:
    pcStack_10 = "Bad Request";
    break;
  case 0x191:
    pcStack_10 = "Unauthorized";
    break;
  case 0x192:
    pcStack_10 = "Payment Required";
    break;
  case 0x193:
    pcStack_10 = "Forbidden";
    break;
  case 0x194:
    pcStack_10 = "Not Found";
    break;
  case 0x195:
    pcStack_10 = "Method Not Allowed";
    break;
  case 0x196:
    pcStack_10 = "Not Acceptable";
    break;
  case 0x197:
    pcStack_10 = "Proxy Authentication Required";
    break;
  case 0x198:
    pcStack_10 = "Request Timeout";
    break;
  case 0x199:
    pcStack_10 = "Conflict";
    break;
  case 0x19a:
    pcStack_10 = "Gone";
    break;
  case 0x19b:
    pcStack_10 = "Length Required";
    break;
  case 0x19c:
    pcStack_10 = "Precondition Failed";
    break;
  case 0x19d:
    pcStack_10 = "Payload Too Large";
    break;
  case 0x19e:
    pcStack_10 = "URI Too Long";
    break;
  case 0x19f:
    pcStack_10 = "Unsupported Media Type";
    break;
  case 0x1a0:
    pcStack_10 = "Range Not Satisfiable";
    break;
  case 0x1a1:
    pcStack_10 = "Expectation Failed";
    break;
  case 0x1a2:
    pcStack_10 = "I\'m a teapot";
    break;
  case 0x1a5:
    pcStack_10 = "Misdirected Request";
    break;
  case 0x1a6:
    pcStack_10 = "Unprocessable Entity";
    break;
  case 0x1a7:
    pcStack_10 = "Locked";
    break;
  case 0x1a8:
    pcStack_10 = "Failed Dependency";
    break;
  case 0x1a9:
    pcStack_10 = "Too Early";
    break;
  case 0x1aa:
    pcStack_10 = "Upgrade Required";
    break;
  case 0x1ac:
    pcStack_10 = "Precondition Required";
    break;
  case 0x1ad:
    pcStack_10 = "Too Many Requests";
    break;
  case 0x1af:
    pcStack_10 = "Request Header Fields Too Large";
    break;
  case 0x1c3:
    pcStack_10 = "Unavailable For Legal Reasons";
    break;
  case 0x1f5:
    pcStack_10 = "Not Implemented";
    break;
  case 0x1f6:
    pcStack_10 = "Bad Gateway";
    break;
  case 0x1f7:
    pcStack_10 = "Service Unavailable";
    break;
  case 0x1f8:
    pcStack_10 = "Gateway Timeout";
    break;
  case 0x1f9:
    pcStack_10 = "HTTP Version Not Supported";
    break;
  case 0x1fa:
    pcStack_10 = "Variant Also Negotiates";
    break;
  case 0x1fb:
    pcStack_10 = "Insufficient Storage";
    break;
  case 0x1fc:
    pcStack_10 = "Loop Detected";
    break;
  case 0x1fe:
    pcStack_10 = "Not Extended";
    break;
  case 0x1ff:
    pcStack_10 = "Network Authentication Required";
  }
  return pcStack_10;
}

Assistant:

inline const char *status_message(int status) {
  switch (status) {
  case 100: return "Continue";
  case 101: return "Switching Protocol";
  case 102: return "Processing";
  case 103: return "Early Hints";
  case 200: return "OK";
  case 201: return "Created";
  case 202: return "Accepted";
  case 203: return "Non-Authoritative Information";
  case 204: return "No Content";
  case 205: return "Reset Content";
  case 206: return "Partial Content";
  case 207: return "Multi-Status";
  case 208: return "Already Reported";
  case 226: return "IM Used";
  case 300: return "Multiple Choice";
  case 301: return "Moved Permanently";
  case 302: return "Found";
  case 303: return "See Other";
  case 304: return "Not Modified";
  case 305: return "Use Proxy";
  case 306: return "unused";
  case 307: return "Temporary Redirect";
  case 308: return "Permanent Redirect";
  case 400: return "Bad Request";
  case 401: return "Unauthorized";
  case 402: return "Payment Required";
  case 403: return "Forbidden";
  case 404: return "Not Found";
  case 405: return "Method Not Allowed";
  case 406: return "Not Acceptable";
  case 407: return "Proxy Authentication Required";
  case 408: return "Request Timeout";
  case 409: return "Conflict";
  case 410: return "Gone";
  case 411: return "Length Required";
  case 412: return "Precondition Failed";
  case 413: return "Payload Too Large";
  case 414: return "URI Too Long";
  case 415: return "Unsupported Media Type";
  case 416: return "Range Not Satisfiable";
  case 417: return "Expectation Failed";
  case 418: return "I'm a teapot";
  case 421: return "Misdirected Request";
  case 422: return "Unprocessable Entity";
  case 423: return "Locked";
  case 424: return "Failed Dependency";
  case 425: return "Too Early";
  case 426: return "Upgrade Required";
  case 428: return "Precondition Required";
  case 429: return "Too Many Requests";
  case 431: return "Request Header Fields Too Large";
  case 451: return "Unavailable For Legal Reasons";
  case 501: return "Not Implemented";
  case 502: return "Bad Gateway";
  case 503: return "Service Unavailable";
  case 504: return "Gateway Timeout";
  case 505: return "HTTP Version Not Supported";
  case 506: return "Variant Also Negotiates";
  case 507: return "Insufficient Storage";
  case 508: return "Loop Detected";
  case 510: return "Not Extended";
  case 511: return "Network Authentication Required";

  default:
  case 500: return "Internal Server Error";
  }
}